

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalCopyToFile::WriteRotateInternal
          (PhysicalCopyToFile *this,ExecutionContext *context,GlobalSinkState *global_state,
          function<void_(duckdb::GlobalFunctionData_&)> *fun)

{
  __pthread_list_t *this_00;
  copy_rotate_next_file_t p_Var1;
  ClientContext *pCVar2;
  __pthread_internal_list *p_Var3;
  copy_to_finalize_t p_Var4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  element_type *peVar7;
  bool bVar8;
  type pGVar9;
  type pFVar10;
  type global_lock;
  StorageLock *this_01;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  pointer *local_68;
  ExecutionContext *local_60;
  pointer local_58;
  StorageLock local_50;
  optional_idx *local_40;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> local_38;
  
  local_38._M_head_impl = global_state + 1;
  this_00 = &global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
             __list;
  local_68 = &global_state[2].super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_58 = (pointer)&this->bind_data;
  local_40 = &this->file_size_bytes;
  local_50.internals.internal.
  super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&(this->super_PhysicalOperator).sink_state;
  local_60 = context;
  do {
    StorageLock::GetExclusiveLock((StorageLock *)local_78);
    pGVar9 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)this_00);
    unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true>::operator*
              ((unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true> *)
               local_68);
    if (this->rotate == true) {
      p_Var1 = (this->function).rotate_next_file;
      pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
                operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                           *)local_58);
      bVar8 = (*p_Var1)(pGVar9,pFVar10,local_40);
      if (!bVar8) goto LAB_0156cfaf;
      local_78._8_8_ = this_00->__prev;
      this_00->__prev = (__pthread_internal_list *)0x0;
      pCVar2 = local_60->client;
      global_lock = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                    ::operator*((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                                 *)local_50.internals.internal.
                                   super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
      unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
      operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                 *)local_78);
      CreateFileState((PhysicalCopyToFile *)local_80,(ClientContext *)this,(GlobalSinkState *)pCVar2
                      ,(StorageLockKey *)global_lock);
      auVar5 = local_80;
      local_80 = (undefined1  [8])0x0;
      p_Var3 = this_00->__prev;
      this_00->__prev = (__pthread_internal_list *)auVar5;
      if (p_Var3 != (__pthread_internal_list *)0x0) {
        (*(code *)p_Var3->__prev->__next)();
        if ((_Tuple_impl<0UL,_duckdb::StorageLock_*,_std::default_delete<duckdb::StorageLock>_>)
            local_80 != (StorageLock *)0x0) {
          (**(code **)(*(_func_int **)local_80 + 8))();
        }
      }
      local_80 = (undefined1  [8])*local_68;
      *local_68 = (pointer)0x0;
      this_01 = (StorageLock *)operator_new(0x10);
      StorageLock::StorageLock(this_01);
      ::std::__uniq_ptr_impl<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>::reset
                ((__uniq_ptr_impl<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_> *)
                 local_68,this_01);
      uVar6 = local_78._0_8_;
      local_78._0_8_ = (_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)0x0;
      if ((element_type *)uVar6 != (element_type *)0x0) {
        StorageLockKey::~StorageLockKey((StorageLockKey *)uVar6);
        operator_delete((void *)uVar6);
      }
      unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true>::operator->
                ((unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true> *)
                 local_80);
      StorageLock::GetExclusiveLock(&local_50);
      p_Var4 = (this->function).copy_to_finalize;
      pCVar2 = local_60->client;
      pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
                operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                           *)local_58);
      pGVar9 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
               ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                            *)(local_78 + 8));
      (*p_Var4)(pCVar2,pFVar10,pGVar9);
      peVar7 = local_50.internals.internal.
               super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_50.internals.internal.
          super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        StorageLockKey::~StorageLockKey
                  ((StorageLockKey *)
                   local_50.internals.internal.
                   super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        operator_delete(peVar7);
      }
      auVar5 = local_80;
      if (local_80 != (undefined1  [8])0x0) {
        StorageLock::~StorageLock((StorageLock *)local_80);
        operator_delete((void *)auVar5);
      }
      if ((StorageLockKey *)local_78._8_8_ != (StorageLockKey *)0x0) {
        (*(code *)(((((shared_ptr<duckdb::StorageLockInternals,_true> *)local_78._8_8_)->internal).
                    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::StorageLockInternals>).
                  __weak_this_.internal.
                  super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      bVar8 = true;
    }
    else {
LAB_0156cfaf:
      StorageLock::GetSharedLock((StorageLock *)(local_78 + 8));
      uVar6 = local_78._0_8_;
      local_78._0_8_ = (_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)0x0;
      if ((element_type *)uVar6 != (element_type *)0x0) {
        StorageLockKey::~StorageLockKey((StorageLockKey *)uVar6);
        operator_delete((void *)uVar6);
      }
      if ((fun->super__Function_base)._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*fun->_M_invoker)((_Any_data *)fun,pGVar9);
      uVar6 = local_78._8_8_;
      if ((StorageLockKey *)local_78._8_8_ != (StorageLockKey *)0x0) {
        StorageLockKey::~StorageLockKey((StorageLockKey *)local_78._8_8_);
        operator_delete((void *)uVar6);
      }
      bVar8 = false;
    }
    uVar6 = local_78._0_8_;
    if ((_Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>)
        local_78._0_8_ != (StorageLockKey *)0x0) {
      StorageLockKey::~StorageLockKey((StorageLockKey *)local_78._0_8_);
      operator_delete((void *)uVar6);
    }
    if (!bVar8) {
      return;
    }
  } while( true );
}

Assistant:

void PhysicalCopyToFile::WriteRotateInternal(ExecutionContext &context, GlobalSinkState &global_state,
                                             const std::function<void(GlobalFunctionData &)> &fun) const {
	auto &g = global_state.Cast<CopyToFunctionGlobalState>();

	// Loop until we can write (synchronize using locks when using parallel writes to the same files and "rotate")
	while (true) {
		// Grab global lock and dereference the current file state (and corresponding lock)
		auto global_guard = g.lock.GetExclusiveLock();
		auto &file_state = *g.global_state;
		auto &file_lock = *g.file_write_lock_if_rotating;
		if (rotate && function.rotate_next_file(file_state, *bind_data, file_size_bytes)) {
			// Global state must be rotated. Move to local scope, create an new one, and immediately release global lock
			auto owned_gstate = std::move(g.global_state);
			g.global_state = CreateFileState(context.client, *sink_state, *global_guard);
			auto owned_lock = std::move(g.file_write_lock_if_rotating);
			g.file_write_lock_if_rotating = make_uniq<StorageLock>();
			global_guard.reset();

			// This thread now waits for the exclusive lock on this file while other threads complete their writes
			// Note that new writes can still start, as there is already a new global state
			auto file_guard = owned_lock->GetExclusiveLock();
			function.copy_to_finalize(context.client, *bind_data, *owned_gstate);
		} else {
			// Get shared file write lock while holding global lock,
			// so file can't be rotated before we get the write lock
			auto file_guard = file_lock.GetSharedLock();

			// Because we got the shared lock on the file, we're sure that it will keep existing until we release it
			global_guard.reset();

			// Sink/Combine!
			fun(file_state);
			break;
		}
	}
}